

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void __thiscall
FPalette::MakeRemap(FPalette *this,DWORD *colors,BYTE *remap,BYTE *useful,int numcolors)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  size_t __nmemb;
  RemappingWork workspace [511];
  
  for (lVar2 = 1; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    workspace[lVar2 + -1].Color = this->BaseColors[lVar2].field_0.d & 0xffffff;
    workspace[lVar2 + -1].Foreign = '\0';
    workspace[lVar2 + -1].PalEntry = (BYTE)lVar2;
  }
  uVar3 = 0;
  uVar5 = (ulong)(uint)numcolors;
  if (numcolors < 1) {
    uVar5 = uVar3;
  }
  uVar6 = 0xff;
  iVar4 = 0;
  for (; __nmemb = (size_t)(int)uVar6, uVar5 != uVar3; uVar3 = uVar3 + 1) {
    if ((useful == (BYTE *)0x0) || (useful[uVar3] != '\0')) {
      workspace[__nmemb].Color = colors[uVar3] & 0xffffff;
      workspace[__nmemb].Foreign = '\x01';
      workspace[__nmemb].PalEntry = (BYTE)uVar3;
      uVar6 = uVar6 + 1;
      iVar4 = iVar4 + 1;
    }
    else {
      remap[uVar3] = '\0';
    }
  }
  qsort(workspace,__nmemb,8,sortforremap2);
  for (iVar1 = 0; iVar1 < (int)(uVar6 - 1); iVar1 = iVar1 + 1) {
    lVar2 = (long)iVar1;
    if (((workspace[lVar2].Foreign != '\0') && (workspace[lVar2 + 1].Foreign == '\0')) &&
       (workspace[lVar2].Color == workspace[lVar2 + 1].Color)) {
      iVar1 = iVar1 + 1;
      remap[workspace[lVar2].PalEntry] = workspace[lVar2 + 1].PalEntry;
      workspace[lVar2].Foreign = '\x02';
      iVar4 = iVar4 + -1;
    }
  }
  if (0 < iVar4) {
    uVar3 = 0;
    uVar5 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      if (workspace[uVar3].Foreign == '\x01') {
        uVar6 = workspace[uVar3].Color;
        iVar4 = BestColor((uint32 *)this,uVar6 >> 0x10 & 0xff,uVar6 >> 8 & 0xff,uVar6 & 0xff,1,0xff)
        ;
        remap[workspace[uVar3].PalEntry] = (BYTE)iVar4;
      }
    }
  }
  return;
}

Assistant:

void FPalette::MakeRemap (const DWORD *colors, BYTE *remap, const BYTE *useful, int numcolors) const
{
	RemappingWork workspace[255+256];
	int i, j, k;

	// Fill in workspace with the colors from the passed palette and this palette.
	// By sorting this array, we can quickly find exact matches so that we can
	// minimize the time spent calling BestColor for near matches.

	for (i = 1; i < 256; ++i)
	{
		workspace[i-1].Color = DWORD(BaseColors[i]) & 0xFFFFFF;
		workspace[i-1].Foreign = 0;
		workspace[i-1].PalEntry = i;
	}
	for (i = k = 0, j = 255; i < numcolors; ++i)
	{
		if (useful == NULL || useful[i] != 0)
		{
			workspace[j].Color = colors[i] & 0xFFFFFF;
			workspace[j].Foreign = 1;
			workspace[j].PalEntry = i;
			++j;
			++k;
		}
		else
		{
			remap[i] = 0;
		}
	}
	qsort (workspace, j, sizeof(RemappingWork), sortforremap2);

	// Find exact matches
	--j;
	for (i = 0; i < j; ++i)
	{
		if (workspace[i].Foreign)
		{
			if (!workspace[i+1].Foreign && workspace[i].Color == workspace[i+1].Color)
			{
				remap[workspace[i].PalEntry] = workspace[i+1].PalEntry;
				workspace[i].Foreign = 2;
				++i;
				--k;
			}
		}
	}

	// Find near matches
	if (k > 0)
	{
		for (i = 0; i <= j; ++i)
		{
			if (workspace[i].Foreign == 1)
			{
				remap[workspace[i].PalEntry] = BestColor ((DWORD *)BaseColors,
					RPART(workspace[i].Color), GPART(workspace[i].Color), BPART(workspace[i].Color),
					1, 255);
			}
		}
	}
}